

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtObj.c
# Opt level: O1

void NewtClearMapFlags(newtRefArg map,int32_t bit)

{
  newtRef nVar1;
  ulong *puVar2;
  ulong uVar3;
  
  nVar1 = NcClassOf(map);
  if ((nVar1 & 3) == 0) {
    uVar3 = (long)nVar1 >> 2;
  }
  else {
    uVar3 = 0;
    if ((nVar1 != 2) && (nVar1 != 0xfff2)) {
      puVar2 = (ulong *)(nVar1 + 0x17);
      if ((*(byte *)(nVar1 + 3) & 0x40) == 0) {
        puVar2 = (ulong *)*puVar2;
      }
      uVar3 = *puVar2;
    }
  }
  nVar1 = NewtMakeInteger((long)~bit & uVar3);
  NcSetClass(map,nVar1);
  return;
}

Assistant:

void NewtClearMapFlags(newtRefArg map, int32_t bit)
{
    int64_t	flags;
    
    flags = NewtRefToInteger(NcClassOf(map));
    flags &= ~ bit;
    NcSetClass(map, NewtMakeInteger(flags));
}